

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IConfigPtr __thiscall Catch::RunContext::config(RunContext *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Catch::IConfig> *in_RSI;
  shared_ptr<const_Catch::IConfig> *in_RDI;
  IConfigPtr IVar1;
  
  clara::std::shared_ptr<const_Catch::IConfig>::shared_ptr(in_RSI,in_RDI);
  IVar1.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar1.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (IConfigPtr)IVar1.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IConfigPtr RunContext::config() const {
        return m_config;
    }